

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

LogSeverity jbcoin::Logs::fromString(string *s)

{
  bool bVar1;
  LogSeverity LVar2;
  locale local_30 [8];
  locale local_28 [8];
  locale local_20 [8];
  
  std::locale::locale(local_30);
  bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[6]>(s,(char (*) [6])"trace",local_30);
  std::locale::~locale(local_30);
  if (bVar1) {
    return lsTRACE;
  }
  std::locale::locale(local_30);
  bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[6]>(s,(char (*) [6])"debug",local_30);
  std::locale::~locale(local_30);
  if (bVar1) {
    return lsDEBUG;
  }
  std::locale::locale(local_30);
  bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[5]>(s,(char (*) [5])"info",local_30);
  LVar2 = lsINFO;
  if (!bVar1) {
    std::locale::locale(local_28);
    bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[12]>
                      (s,(char (*) [12])"information",local_28);
    std::locale::~locale(local_28);
    std::locale::~locale(local_30);
    if (bVar1) {
      return lsINFO;
    }
    std::locale::locale(local_30);
    bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[5]>(s,(char (*) [5])"warn",local_30)
    ;
    if (!bVar1) {
      std::locale::locale(local_28);
      bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[8]>
                        (s,(char (*) [8])"warning",local_28);
      if (!bVar1) {
        std::locale::locale(local_20);
        bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[9]>
                          (s,(char (*) [9])"warnings",local_20);
        std::locale::~locale(local_20);
        std::locale::~locale(local_28);
        std::locale::~locale(local_30);
        if (bVar1) {
          return lsWARNING;
        }
        std::locale::locale(local_30);
        bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[6]>
                          (s,(char (*) [6])0x28f22c,local_30);
        if (bVar1) {
          std::locale::~locale(local_30);
        }
        else {
          std::locale::locale(local_28);
          bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[7]>
                            (s,(char (*) [7])"errors",local_28);
          std::locale::~locale(local_28);
          std::locale::~locale(local_30);
          if (!bVar1) {
            std::locale::locale(local_30);
            bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[6]>
                              (s,(char (*) [6])"fatal",local_30);
            if (bVar1) {
              LVar2 = lsFATAL;
            }
            else {
              std::locale::locale(local_28);
              bVar1 = boost::algorithm::iequals<std::__cxx11::string,char[7]>
                                (s,(char (*) [7])"fatals",local_28);
              std::locale::~locale(local_28);
              LVar2 = (uint)bVar1 + lsINVALID | lsFATAL;
            }
            goto LAB_001e10c1;
          }
        }
        return lsERROR;
      }
      std::locale::~locale(local_28);
    }
    std::locale::~locale(local_30);
    return lsWARNING;
  }
LAB_001e10c1:
  std::locale::~locale(local_30);
  return LVar2;
}

Assistant:

LogSeverity
Logs::fromString (std::string const& s)
{
    if (boost::iequals (s, "trace"))
        return lsTRACE;

    if (boost::iequals (s, "debug"))
        return lsDEBUG;

    if (boost::iequals (s, "info") || boost::iequals (s, "information"))
        return lsINFO;

    if (boost::iequals (s, "warn") || boost::iequals (s, "warning") || boost::iequals (s, "warnings"))
        return lsWARNING;

    if (boost::iequals (s, "error") || boost::iequals (s, "errors"))
        return lsERROR;

    if (boost::iequals (s, "fatal") || boost::iequals (s, "fatals"))
        return lsFATAL;

    return lsINVALID;
}